

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

D_ParseNode * ambiguity_abort_fn(D_Parser *pp,int n,D_ParseNode **v)

{
  PNode *p;
  ulong uVar1;
  
  if (0 < n && d_verbose_level != 0) {
    uVar1 = 0;
    do {
      p = (PNode *)(v[uVar1] + -2);
      if (v[uVar1] == (D_ParseNode *)0x0) {
        p = (PNode *)0x0;
      }
      print_paren((Parser *)pp,p);
      putchar(10);
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  d_fail("unresolved ambiguity line %d file %s",(ulong)(uint)((*v)->start_loc).line,
         ((*v)->start_loc).pathname);
  return *v;
}

Assistant:

D_ParseNode *ambiguity_abort_fn(D_Parser *pp, int n, D_ParseNode **v) {
  int i;
  if (d_verbose_level) {
    for (i = 0; i < n; i++) {
      print_paren((Parser *)pp, D_ParseNode_to_PNode(v[i]));
      printf("\n");
    }
  }
  d_fail("unresolved ambiguity line %d file %s", v[0]->start_loc.line, v[0]->start_loc.pathname);
  return v[0];
}